

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Factor(DataParser *parser)

{
  DataParser *this;
  allocator<char> local_39;
  String local_38;
  char local_11;
  DataParser *pDStack_10;
  char c;
  DataParser *parser_local;
  
  pDStack_10 = parser;
  local_11 = DataParser::Look(parser);
  this = pDStack_10;
  if (local_11 == '(') {
    DataParser::Match(pDStack_10,'(',true);
    Expression(pDStack_10);
    DataParser::Match(pDStack_10,')',true);
  }
  else if (local_11 == '\'') {
    DataParser::Match(pDStack_10,'\'',false);
    StringLiteral(pDStack_10);
    DataParser::Match(pDStack_10,'\'',true);
  }
  else if (local_11 == '!') {
    Not(pDStack_10);
    DataParser::SkipWhitespace(pDStack_10);
  }
  else if ((local_11 == '-') || (('/' < local_11 && (local_11 < ':')))) {
    NumberLiteral(pDStack_10);
    DataParser::SkipWhitespace(pDStack_10);
  }
  else if (((local_11 < 'a') || ('z' < local_11)) && ((local_11 < 'A' || ('Z' < local_11)))) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"literal, variable name, function name, parenthesis, or \'!\'",
               &local_39);
    DataParser::Expected(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator(&local_39);
  }
  else {
    VariableOrFunction(pDStack_10);
    DataParser::SkipWhitespace(pDStack_10);
  }
  return;
}

Assistant:

static void Factor(DataParser& parser)
	{
		const char c = parser.Look();

		if (c == '(')
		{
			parser.Match('(');
			Expression(parser);
			parser.Match(')');
		}
		else if (c == '\'')
		{
			parser.Match('\'', false);
			StringLiteral(parser);
			parser.Match('\'');
		}
		else if (c == '!')
		{
			Not(parser);
			parser.SkipWhitespace();
		}
		else if (c == '-' || (c >= '0' && c <= '9'))
		{
			NumberLiteral(parser);
			parser.SkipWhitespace();
		}
		else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
		{
			VariableOrFunction(parser);
			parser.SkipWhitespace();
		}
		else
			parser.Expected("literal, variable name, function name, parenthesis, or '!'");
	}